

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

double HTS_lsp2en(HTS_Vocoder *v,double *lsp,size_t m,double alpha)

{
  size_t sVar1;
  double *pdVar2;
  double *a;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int m_00;
  double dVar6;
  
  a = v->spectrum2en_buff;
  if (v->spectrum2en_size < m) {
    if (a != (double *)0x0) {
      HTS_free(a);
    }
    a = (double *)HTS_calloc(m + 0x241,8);
    v->spectrum2en_buff = a;
    v->spectrum2en_size = m;
  }
  m_00 = (int)m;
  HTS_lsp2lpc(v,lsp + 1,a,m_00);
  dVar6 = *lsp;
  if (v->use_log_gain != '\0') {
    dVar6 = exp(dVar6);
  }
  pdVar2 = v->spectrum2en_buff;
  *pdVar2 = dVar6;
  HTS_ignorm(pdVar2,pdVar2,m_00,v->gamma);
  pdVar2 = v->spectrum2en_buff;
  if (m != 0) {
    sVar1 = v->stage;
    uVar3 = 2;
    if (2 < m + 1) {
      uVar3 = m + 1;
    }
    uVar5 = 1;
    do {
      pdVar2[uVar5] =
           pdVar2[uVar5] *
           -(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  HTS_mgc2mgc(v,pdVar2,m_00,alpha,v->gamma,a + m + 1,0x23f,0.0,1.0);
  dVar6 = 0.0;
  lVar4 = 1;
  do {
    dVar6 = dVar6 + a[m + lVar4] * a[m + lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x241);
  return dVar6;
}

Assistant:

static double HTS_lsp2en(HTS_Vocoder * v, double *lsp, size_t m, double alpha)
{
   size_t i;
   double en = 0.0;
   double *buff;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc(m + 1 + IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   buff = v->spectrum2en_buff + m + 1;

   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, v->spectrum2en_buff, m);
   if (v->use_log_gain)
      v->spectrum2en_buff[0] = exp(lsp[0]);
   else
      v->spectrum2en_buff[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(v->spectrum2en_buff, v->spectrum2en_buff, m, v->gamma);
   else if (MULGFLG1)
      v->spectrum2en_buff[0] = (1.0 - v->spectrum2en_buff[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = 1; i <= m; i++)
         v->spectrum2en_buff[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, v->spectrum2en_buff, m, alpha, v->gamma, buff, IRLENG - 1, 0.0, 1);

   for (i = 0; i < IRLENG; i++)
      en += buff[i] * buff[i];
   return en;
}